

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::
HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
MatchAndExplain(HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,StringView *s,MatchResultListener *listener)

{
  bool bVar1;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  MatchResultListener *listener_local;
  StringView *s_local;
  HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)listener;
  listener_local = (MatchResultListener *)s;
  s_local = (StringView *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_48,s,&local_49);
  std::allocator<char>::~allocator(&local_49);
  local_28 = &local_48;
  bVar1 = HasSubstrMatcher<std::__cxx11::string>::MatchAndExplain<std::__cxx11::string>
                    ((HasSubstrMatcher<std::__cxx11::string> *)this,local_28,
                     (MatchResultListener *)str);
  std::__cxx11::string::~string((string *)&local_48);
  return bVar1;
}

Assistant:

bool MatchAndExplain(const internal::StringView& s,
                       MatchResultListener* listener) const {
    // This should fail to compile if StringView is used with wide
    // strings.
    const StringType& str = std::string(s);
    return MatchAndExplain(str, listener);
  }